

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_libapi.cpp
# Opt level: O0

ze_result_t
zesFrequencyOcSetVoltageTarget
          (zes_freq_handle_t hFrequency,double CurrentVoltageTarget,double CurrentVoltageOffset)

{
  zes_pfnFrequencyOcSetVoltageTarget_t p_Var1;
  __pointer_type p_Var2;
  zes_pfnFrequencyOcSetVoltageTarget_t pfnOcSetVoltageTarget;
  double CurrentVoltageOffset_local;
  double CurrentVoltageTarget_local;
  zes_freq_handle_t hFrequency_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    p_Var2 = std::atomic<_zes_dditable_t_*>::load
                       ((atomic<_zes_dditable_t_*> *)(ze_lib::context + 0x20),memory_order_seq_cst);
    p_Var1 = (p_Var2->Frequency).pfnOcSetVoltageTarget;
    if (p_Var1 == (zes_pfnFrequencyOcSetVoltageTarget_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hFrequency_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hFrequency_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      hFrequency_local._4_4_ = (*p_Var1)(hFrequency,CurrentVoltageTarget,CurrentVoltageOffset);
    }
  }
  else {
    hFrequency_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hFrequency_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zesFrequencyOcSetVoltageTarget(
    zes_freq_handle_t hFrequency,                   ///< [in] Handle for the component.
    double CurrentVoltageTarget,                    ///< [in] Overclock voltage in Volts. This cannot be greater than the
                                                    ///< `maxOcVoltage` member of ::zes_oc_capabilities_t.
    double CurrentVoltageOffset                     ///< [in] This voltage offset is applied to all points on the
                                                    ///< voltage/frequency curve, include the new overclock voltageTarget.
                                                    ///< Valid range is between the `minOcVoltageOffset` and
                                                    ///< `maxOcVoltageOffset` members of ::zes_oc_capabilities_t.
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const zes_pfnFrequencyOcSetVoltageTarget_t pfnOcSetVoltageTarget = [&result] {
        auto pfnOcSetVoltageTarget = ze_lib::context->zesDdiTable.load()->Frequency.pfnOcSetVoltageTarget;
        if( nullptr == pfnOcSetVoltageTarget ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnOcSetVoltageTarget;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnOcSetVoltageTarget( hFrequency, CurrentVoltageTarget, CurrentVoltageOffset );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnOcSetVoltageTarget = ze_lib::context->zesDdiTable.load()->Frequency.pfnOcSetVoltageTarget;
    if( nullptr == pfnOcSetVoltageTarget ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnOcSetVoltageTarget( hFrequency, CurrentVoltageTarget, CurrentVoltageOffset );
    #endif
}